

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeDensity.cpp
# Opt level: O2

void __thiscall OpenMD::PipeDensity::process(PipeDensity *this)

{
  SelectionManager *this_00;
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  SimInfo *info;
  Snapshot *this_01;
  pointer pvVar7;
  long lVar8;
  pointer pvVar9;
  uint i;
  ulong uVar10;
  uint j;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  RealType RVar14;
  double dVar15;
  StuntDouble *sd;
  int ii;
  Vector3d pos;
  Mat3x3d hmat;
  DumpReader reader;
  value_type local_1320;
  int local_1314;
  SelectionEvaluator *local_1310;
  ulong local_1308;
  double local_1300;
  double local_12f8;
  int local_12ec;
  SelectionSet local_12e8;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar1 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  local_1314 = DumpReader::getNFrames(&local_1288);
  iVar2 = (this->super_StaticAnalyser).step_;
  uVar10 = (long)local_1314 % (long)iVar2 & 0xffffffff;
  this->nProcessed_ = local_1314 / iVar2;
  local_1310 = &this->evaluator_;
  this_00 = &this->seleMan_;
  uVar12 = 0;
  while ((int)uVar12 < local_1314) {
    local_1308 = uVar12;
    DumpReader::readFrame(&local_1288,(int)uVar12);
    this_01 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    this->currentSnapshot_ = this_01;
    uVar3 = this->nBins2_;
    uVar4 = (this->super_StaticAnalyser).nBins_;
    for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
      pvVar7 = (this->sliceSDLists_).
               super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (lVar11 = 0; (ulong)uVar4 * 0x18 - lVar11 != 0; lVar11 = lVar11 + 0x18) {
        lVar8 = *(long *)&pvVar7[uVar10].
                          super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        if (*(long *)(lVar8 + 8 + lVar11) != *(long *)(lVar8 + lVar11)) {
          *(long *)(lVar8 + 8 + lVar11) = *(long *)(lVar8 + lVar11);
        }
      }
    }
    RVar14 = Snapshot::getVolume(this_01);
    uVar3 = (this->super_StaticAnalyser).nBins_;
    uVar4 = this->nBins2_;
    Snapshot::getHmat(&local_12d0,this->currentSnapshot_);
    local_12f8 = *(double *)
                  ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_ + (ulong)(uint)this->axis1_ * 0x20) * 0.5;
    local_1300 = *(double *)
                  ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_ + (ulong)(uint)this->axis2_ * 0x20) * 0.5;
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_12e8,local_1310);
      SelectionManager::setSelectionSet(this_00,&local_12e8);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_12e8.bitsets_);
    }
    local_1320 = SelectionManager::beginSelected(this_00,&local_12ec);
    while (local_1320 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_12e8,local_1320);
      if (cVar1 != '\0') {
        Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_12e8);
      }
      StuntDouble::setPos(local_1320,(Vector3d *)&local_12e8);
      local_1320 = SelectionManager::nextSelected(this_00,&local_12ec);
    }
    local_1320 = SelectionManager::beginSelected(this_00,&local_12ec);
    while (local_1320 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_12e8,local_1320);
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                 ((long)(int)((((double)(&local_12e8.bitsets_.
                                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                          ._M_impl.super__Vector_impl_data._M_start)
                                        [(uint)this->axis2_] + local_1300) *
                              (double)(this->super_StaticAnalyser).nBins_) /
                             *(double *)
                              ((long)local_12d0.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_ +
                              (ulong)(uint)this->axis2_ * 0x20)) * 0x18 +
                 *(long *)&(this->sliceSDLists_).
                           super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start
                           [(int)((((double)(&local_12e8.bitsets_.
                                              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                              ._M_impl.super__Vector_impl_data._M_start)
                                            [(uint)this->axis1_] + local_12f8) *
                                  (double)this->nBins2_) /
                                 *(double *)
                                  ((long)local_12d0.super_SquareMatrix<double,_3>.
                                         super_RectMatrix<double,_3U,_3U>.data_ +
                                  (ulong)(uint)this->axis1_ * 0x20))].
                           super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                           ._M_impl.super__Vector_impl_data),&local_1320);
      local_1320 = SelectionManager::nextSelected(this_00,&local_12ec);
    }
    uVar5 = this->nBins2_;
    uVar6 = (this->super_StaticAnalyser).nBins_;
    for (uVar10 = 0; uVar10 != uVar5; uVar10 = uVar10 + 1) {
      pvVar7 = (this->sliceSDLists_).
               super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar9 = (this->density_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar12 = 0; uVar12 != uVar6; uVar12 = uVar12 + 1) {
        lVar11 = *(long *)&pvVar7[uVar10].
                           super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        lVar8 = *(long *)(lVar11 + uVar12 * 0x18);
        dVar15 = 0.0;
        for (uVar13 = 0; (ulong)uVar13 < (ulong)(*(long *)(lVar11 + 8 + uVar12 * 0x18) - lVar8 >> 3)
            ; uVar13 = uVar13 + 1) {
          dVar15 = dVar15 + *(double *)(*(long *)(lVar8 + (ulong)uVar13 * 8) + 0x38);
        }
        lVar11 = *(long *)&pvVar9[uVar10].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        *(double *)(lVar11 + uVar12 * 8) =
             dVar15 / (RVar14 / (double)(uVar3 * uVar4)) + *(double *)(lVar11 + uVar12 * 8);
      }
    }
    local_1320 = (value_type)0x0;
    uVar12 = (ulong)(uint)((int)local_1308 + (this->super_StaticAnalyser).step_);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this,uVar12,uVar10);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void PipeDensity::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          sliceSDLists_[i][j].clear();
        }
      }

      RealType sliceVolume = currentSnapshot_->getVolume() / (nBins2_ * nBins_);
      Mat3x3d hmat         = currentSnapshot_->getHmat();

      RealType halfBox1_ = hmat(axis1_, axis1_) / 2.0;
      RealType halfBox2_ = hmat(axis2_, axis2_) / 2.0;

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo1 =
            int(nBins2_ * (halfBox1_ + pos[axis1_]) / hmat(axis1_, axis1_));
        int binNo2 =
            int(nBins_ * (halfBox2_ + pos[axis2_]) / hmat(axis2_, axis2_));
        sliceSDLists_[binNo1][binNo2].push_back(sd);
      }

      // loop over the slices to calculate the densities
      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          RealType totalMass = 0;
          for (unsigned int k = 0; k < sliceSDLists_[i][j].size(); ++k) {
            totalMass += sliceSDLists_[i][j][k]->getMass();
          }
          density_[i][j] += totalMass / sliceVolume;
        }
      }
    }

    writeDensity();
  }